

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.cpp
# Opt level: O2

string * __thiscall
OutputIterations::get_current_iteration_string_abi_cxx11_
          (string *__return_storage_ptr__,OutputIterations *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  char str_buffer [100];
  allocator local_79;
  char local_78 [104];
  
  auVar6._8_8_ = 0x3fdfffffffffffff;
  auVar6._0_8_ = 0x3fdfffffffffffff;
  dVar1 = (((this->iteration_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[this->current_iteration_index] * 0.5) /
          3.141592653589793) * 100.0;
  auVar2._8_8_ = 0x8000000000000000;
  auVar2._0_8_ = 0x8000000000000000;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar1;
  auVar2 = vpternlogq_avx512vl(auVar6,auVar3,auVar2,0xf8);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar1 + auVar2._0_8_;
  auVar2 = vroundsd_avx(auVar4,auVar4,0xb);
  auVar5._0_4_ = (int)auVar2._0_8_;
  auVar5._4_4_ = (int)auVar2._8_8_;
  auVar5._8_8_ = 0;
  auVar2 = vcvtdq2pd_avx(auVar5);
  sprintf(local_78,"%g",auVar2._0_8_ / 100.0);
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_78,&local_79);
  return __return_storage_ptr__;
}

Assistant:

std::string OutputIterations::get_current_iteration_string() const {
    const double ACCURACY = 100.;

    double value = static_cast<int>(round(get_current_iteration_time() / 2 / PI * ACCURACY)) / ACCURACY;

    char str_buffer[100];
    sprintf(str_buffer, "%g", value);
    return std::string(str_buffer);
}